

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OrderedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedPortConnectionSyntax,slang::syntax::OrderedPortConnectionSyntax_const&>
          (BumpAllocator *this,OrderedPortConnectionSyntax *args)

{
  OrderedPortConnectionSyntax *this_00;
  
  this_00 = (OrderedPortConnectionSyntax *)allocate(this,0x58,8);
  slang::syntax::OrderedPortConnectionSyntax::OrderedPortConnectionSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }